

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGenGrid2D.cpp
# Opt level: O2

bool __thiscall
TPZGenGrid2D::ReadAndMergeGeoMesh
          (TPZGenGrid2D *this,TPZGeoMesh *gridinitial,TPZGeoMesh *tomerge,int matid)

{
  double dVar1;
  bool bVar2;
  TPZGeoEl *pTVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  TPZAdmChunkVector<TPZGeoNode,_10> *this_00;
  TPZGeoNode *pTVar8;
  TPZGeoNode *pTVar9;
  TPZGeoEl **ppTVar10;
  long lVar11;
  undefined4 extraout_var;
  long lVar12;
  long lVar13;
  long lVar14;
  int p_1;
  int iVar15;
  int p;
  int iVar16;
  ulong uVar17;
  int64_t iVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  REAL RVar22;
  TPZVec<double> coordtomerge;
  TPZVec<long> nos;
  TPZVec<double> coordinitial;
  int64_t index;
  TPZGeoMesh gtomerge;
  
  iVar4 = (*this->_vptr_TPZGenGrid2D[2])(this,gridinitial,(ulong)(uint)matid);
  if (((short)iVar4 == 0) &&
     (((tomerge->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements != 0 ||
      ((tomerge->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements != 0)))) {
    TPZGeoMesh::TPZGeoMesh(&gtomerge,tomerge);
    lVar14 = (gridinitial->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements;
    coordtomerge._vptr_TPZVec = (_func_int **)0x0;
    TPZVec<double>::TPZVec(&coordinitial,3,(double *)&coordtomerge);
    nos._vptr_TPZVec = (_func_int **)0x0;
    TPZVec<double>::TPZVec(&coordtomerge,3,(double *)&nos);
    this_00 = &gridinitial->fNodeVec;
    lVar19 = 0;
    lVar20 = 0;
    if (0 < lVar14) {
      lVar20 = lVar14;
    }
    lVar12 = gtomerge.fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>.fNElements;
    if (gtomerge.fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>.fNElements < 1) {
      lVar12 = lVar19;
    }
    for (; lVar19 != lVar12; lVar19 = lVar19 + 1) {
      pTVar8 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                         (&gtomerge.fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>,lVar19);
      TPZGeoNode::GetCoordinates(pTVar8,&coordtomerge);
      for (lVar13 = 0; lVar11 = lVar20, lVar20 != lVar13; lVar13 = lVar13 + 1) {
        pTVar9 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                           (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,lVar13);
        TPZGeoNode::GetCoordinates(pTVar9,&coordinitial);
        RVar22 = Distance(&coordtomerge,&coordinitial);
        if (ABS(RVar22) < 1e-12) {
          TPZGeoNode::SetCoord(pTVar8,0,(double)pTVar8->fId);
          pTVar9 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,lVar13);
          pTVar8->fId = pTVar9->fId;
          lVar11 = lVar13;
          break;
        }
      }
      if (lVar11 == lVar14) {
        iVar5 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this_00);
        pTVar9 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                           (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar5);
        TPZGeoNode::Initialize(pTVar9,&coordtomerge,gridinitial);
        pTVar9 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                           (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar5);
        iVar5 = pTVar9->fId;
        iVar15 = pTVar8->fId;
        for (lVar13 = 0;
            lVar13 < gtomerge.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
            lVar13 = lVar13 + 1) {
          ppTVar10 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                               (&gtomerge.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>,lVar13);
          pTVar3 = *ppTVar10;
          if (pTVar3 != (TPZGeoEl *)0x0) {
            for (iVar16 = 0; iVar6 = (**(code **)(*(long *)pTVar3 + 0x90))(pTVar3), iVar16 < iVar6;
                iVar16 = iVar16 + 1) {
              lVar11 = (**(code **)(*(long *)pTVar3 + 0xa8))(pTVar3,iVar16);
              if (lVar11 == iVar15) {
                (**(code **)(*(long *)pTVar3 + 0x178))(pTVar3,iVar16,(long)iVar5);
              }
            }
          }
        }
        pTVar8->fId = -1;
      }
    }
    for (lVar14 = 0; lVar14 != lVar12; lVar14 = lVar14 + 1) {
      pTVar8 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                         (&gtomerge.fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>,lVar14);
      iVar5 = pTVar8->fId;
      if ((long)iVar5 != -1) {
        dVar1 = pTVar8->fCoord[0];
        for (lVar20 = 0;
            lVar20 < gtomerge.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
            lVar20 = lVar20 + 1) {
          ppTVar10 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                               (&gtomerge.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>,lVar20);
          pTVar3 = *ppTVar10;
          if (pTVar3 != (TPZGeoEl *)0x0) {
            for (iVar15 = 0; iVar16 = (**(code **)(*(long *)pTVar3 + 0x90))(pTVar3), iVar15 < iVar16
                ; iVar15 = iVar15 + 1) {
              lVar19 = (**(code **)(*(long *)pTVar3 + 0xa8))(pTVar3,iVar15);
              if (lVar19 == (long)dVar1) {
                (**(code **)(*(long *)pTVar3 + 0x178))(pTVar3,iVar15,(long)iVar5);
              }
            }
          }
        }
      }
    }
    iVar18 = gtomerge.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
    if (gtomerge.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements < 1) {
      iVar18 = 0;
    }
    for (lVar14 = 0; lVar14 != iVar18; lVar14 = lVar14 + 1) {
      ppTVar10 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                           (&gtomerge.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>,lVar14);
      pTVar3 = *ppTVar10;
      if (pTVar3 != (TPZGeoEl *)0x0) {
        nos._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
        nos.fStore = (long *)0x0;
        nos.fNElements = 0;
        nos.fNAlloc = 0;
        uVar7 = (**(code **)(*(long *)pTVar3 + 0x90))(pTVar3);
        uVar21 = (ulong)uVar7;
        iVar5 = (**(code **)(*(long *)pTVar3 + 0x90))(pTVar3);
        TPZVec<long>::Resize(&nos,(long)iVar5);
        if ((int)uVar7 < 1) {
          uVar21 = 0;
        }
        for (uVar17 = 0; uVar21 != uVar17; uVar17 = uVar17 + 1) {
          lVar20 = (**(code **)(*(long *)pTVar3 + 0xa8))(pTVar3,uVar17 & 0xffffffff);
          nos.fStore[uVar17] = lVar20;
        }
        bVar2 = this->fRefPattern;
        uVar7 = (**(code **)(*(long *)pTVar3 + 0xb8))(pTVar3);
        iVar5 = (*(gridinitial->super_TPZSavable)._vptr_TPZSavable[0xc])
                          (gridinitial,(ulong)uVar7,&nos,(ulong)(uint)pTVar3->fMatId,&index,
                           (ulong)bVar2);
        if (CONCAT44(extraout_var,iVar5) == 0) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZGenGrid2D.cpp"
                     ,0x111);
        }
        TPZVec<long>::~TPZVec(&nos);
      }
    }
    TPZGeoMesh::ResetConnectivities(gridinitial);
    TPZGeoMesh::BuildConnectivity(gridinitial);
    TPZVec<double>::~TPZVec(&coordtomerge);
    TPZVec<double>::~TPZVec(&coordinitial);
    TPZGeoMesh::~TPZGeoMesh(&gtomerge);
  }
  return (short)iVar4 == 0;
}

Assistant:

bool TPZGenGrid2D::ReadAndMergeGeoMesh(TPZGeoMesh* gridinitial, TPZGeoMesh* tomerge, int matid) {
    // gridinitial is created by TPZGenGrid2D current
    if (Read(gridinitial, matid))
        return false;
    if (!tomerge->NNodes() && !tomerge->NElements())
        return true;

    // Copy vectors for nodes and elements of the gridtomerge, then the original data is preserved
    TPZGeoMesh gtomerge(*tomerge);
    TPZGeoMesh *gridtomerge = &gtomerge;

    int64_t i, j, k, nnodestomerge = gridtomerge->NNodes();
    int64_t nnodesinitial = gridinitial->NNodes();
    //    int nneltomerge = gridtomerge->NElements();
    TPZVec<REAL> coordinitial(3, 0.);
    TPZVec<REAL> coordtomerge(3, 0.);
    TPZGeoNode *nodetomerge;
    TPZGeoEl *gel;
    // Verifing each node in gridtomerge if exist into the gridinitial (as same coordinates). It is inefficient.
    for (i = 0; i < nnodestomerge; i++) {
        nodetomerge = &(gridtomerge->NodeVec()[i]);
        if (!nodetomerge) continue;
        nodetomerge->GetCoordinates(coordtomerge);
        for (j = 0; j < nnodesinitial; j++) {
            gridinitial->NodeVec()[j].GetCoordinates(coordinitial);
            if (IsZero(Distance(coordtomerge, coordinitial))) {
                // In this case exists a node with same coordinates, then the id is update as id of the gridinitial with same coordinates
                // and the old id is stored in coord[0]
                nodetomerge->SetCoord(0, nodetomerge->Id());
                nodetomerge->SetNodeId(gridinitial->NodeVec()[j].Id());
                break;
            }
        }

        // If the node (i) not exists into the gridinitial is created a new node copy in this grid, and is substitutived in all the 
        // elements in gridinitial the id as old node with the id of the new node. At last the id of the node duplicated is put as -1
        if (j == nnodesinitial) {
            // resizing the vector of the nodes
            int64_t index = gridinitial->NodeVec().AllocateNewElement();
            gridinitial->NodeVec()[index].Initialize(coordtomerge, *gridinitial);
            index = gridinitial->NodeVec()[index].Id();
            int64_t oldid = nodetomerge->Id();
            for (k = 0; k < gridtomerge->NElements(); k++) {
                gel = gridtomerge->ElementVec()[k];
                if (!gel) continue;
                for (int p = 0; p < gel->NNodes(); p++)
                    if (gel->NodeIndex(p) == oldid)
                        gel->SetNodeIndex(p, index);
            }
            nodetomerge->SetNodeId(-1);
        }
    }

    // changing the id of the repeated nodes into the geometric elements of the gridtomerge
    for (i = 0; i < nnodestomerge; i++) {
        nodetomerge = &(gridtomerge->NodeVec()[i]);
        if (!nodetomerge || nodetomerge->Id() == -1) continue;
        int64_t idnew = nodetomerge->Id(), idold = (int64_t) (nodetomerge->Coord(0));
        for (k = 0; k < gridtomerge->NElements(); k++) {
            gel = gridtomerge->ElementVec()[k];
            if (!gel) continue;
            for (int p = 0; p < gel->NNodes(); p++)
                if (gel->NodeIndex(p) == idold)
                    gel->SetNodeIndex(p, idnew);
        }
    }

    // creating new element into gridinitial corresponding for each element in gridtomerge
    int64_t nelmerge = gridtomerge->NElements();
    for (i = 0; i < nelmerge; i++) {
        gel = gridtomerge->ElementVec()[i];
        if (!gel) continue;
        TPZVec<int64_t> nos;
        int64_t ngelnodes = gel->NNodes(), index;
        nos.Resize(gel->NNodes());
        for (j = 0; j < ngelnodes; j++)
            nos[j] = gel->NodeIndex(j);
        int eltype = 1;
        if (fRefPattern == false) {
            eltype = 0;
        }

        if (!gridinitial->CreateGeoElement(gel->Type(), nos, gel->MaterialId(), index, eltype))
            DebugStop();
    }

    // computing the connectivity
    gridinitial->ResetConnectivities();
    gridinitial->BuildConnectivity();
    return true;
}